

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetTXToolInfo(ndicapi *pol,int ph)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  int i;
  long lVar4;
  int iVar5;
  
  iVar5 = pol->TxHandleCount;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (long)iVar5) {
    uVar3 = 0;
    while ((uint)pol->TxHandles[uVar3] != ph) {
      uVar3 = uVar3 + 1;
      if ((long)iVar5 == uVar3) {
        return 0;
      }
    }
  }
  if ((int)uVar3 != iVar5) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      cVar1 = pol->TxInformation[uVar3 & 0xffffffff][lVar4];
      iVar5 = -0x57;
      if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
         (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) {
        return uVar2;
      }
      uVar2 = uVar2 << 4 | iVar5 + cVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  return uVar2;
}

Assistant:

ndicapiExport int ndiGetTXToolInfo(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxInformation[i];
  return (int)ndiHexToUnsignedLong(dp, 2);
}